

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_create_function16
              (sqlite3 *db,void *zFunctionName,int nArg,int eTextRep,void *p,
              _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xSFunc,
              _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xStep,
              _func_void_sqlite3_context_ptr *xFinal)

{
  int rc;
  int iVar1;
  char *zFunctionName_00;
  u8 enc;
  
  enc = (u8)eTextRep;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  zFunctionName_00 = sqlite3Utf16to8(db,zFunctionName,-1,enc);
  rc = sqlite3CreateFunc(db,zFunctionName_00,nArg,eTextRep,p,xSFunc,xStep,xFinal,
                         (_func_void_sqlite3_context_ptr *)0x0,
                         (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                         (FuncDestructor *)0x0);
  if (zFunctionName_00 != (char *)0x0) {
    sqlite3DbFreeNN(db,zFunctionName_00);
  }
  if ((rc != 0) || (iVar1 = 0, db->mallocFailed != '\0')) {
    iVar1 = apiHandleError(db,rc);
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_create_function16(
  sqlite3 *db,
  const void *zFunctionName,
  int nArg,
  int eTextRep,
  void *p,
  void (*xSFunc)(sqlite3_context*,int,sqlite3_value**),
  void (*xStep)(sqlite3_context*,int,sqlite3_value**),
  void (*xFinal)(sqlite3_context*)
){
  int rc;
  char *zFunc8;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zFunctionName==0 ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  assert( !db->mallocFailed );
  zFunc8 = sqlite3Utf16to8(db, zFunctionName, -1, SQLITE_UTF16NATIVE);
  rc = sqlite3CreateFunc(db, zFunc8, nArg, eTextRep, p, xSFunc,xStep,xFinal,0,0,0);
  sqlite3DbFree(db, zFunc8);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}